

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O1

void __thiscall
helics::TimeDependencies::removeInterdependence(TimeDependencies *this,GlobalFederateId gid)

{
  pointer __src;
  pointer *ppDVar1;
  pointer pDVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer __dest;
  
  __dest = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (long)pDVar2 - (long)__dest) {
    uVar5 = ((ulong)((long)pDVar2 - (long)__dest) >> 3) * 0x2e8ba2e8ba2e8ba3;
    do {
      uVar3 = uVar5 >> 1;
      uVar4 = uVar3;
      if (__dest[uVar3].fedID.gid < gid.gid) {
        uVar4 = ~uVar3 + uVar5;
        __dest = __dest + uVar3 + 1;
      }
      uVar5 = uVar4;
    } while (0 < (long)uVar4);
  }
  if ((__dest != pDVar2) && ((__dest->fedID).gid == gid.gid)) {
    __src = __dest + 1;
    if (__src != pDVar2) {
      memmove(__dest,__src,(long)pDVar2 - (long)__src);
    }
    ppDVar1 = &(this->dependencies).
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppDVar1 = *ppDVar1 + -1;
  }
  return;
}

Assistant:

void TimeDependencies::removeInterdependence(GlobalFederateId gid)
{
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep != dependencies.end()) {
        if (dep->fedID == gid) {
            dependencies.erase(dep);
        }
    }
}